

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O2

int checkcontrol(lua_State *L,char *message,int tocont)

{
  int iVar1;
  int iVar2;
  code *f;
  
  iVar2 = 0;
  if ((tocont == 0) && (*message == '@')) {
    iVar1 = strcmp(message + 1,"off");
    iVar2 = 1;
    if (iVar1 == 0) {
      f = warnfoff;
    }
    else {
      if (message[1] != 'o') {
        return 1;
      }
      if (message[2] != 'n') {
        return 1;
      }
      if (message[3] != '\0') {
        return 1;
      }
      f = warnfon;
    }
    lua_setwarnf(L,f,L);
  }
  return iVar2;
}

Assistant:

static int checkcontrol (lua_State *L, const char *message, int tocont) {
  if (tocont || *(message++) != '@')  /* not a control message? */
    return 0;
  else {
    if (strcmp(message, "off") == 0)
      lua_setwarnf(L, warnfoff, L);  /* turn warnings off */
    else if (strcmp(message, "on") == 0)
      lua_setwarnf(L, warnfon, L);   /* turn warnings on */
    return 1;  /* it was a control message */
  }
}